

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
          *node)

{
  long lVar1;
  long *plVar2;
  runtime_error *this_00;
  long *in_RDX;
  Transformer local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  
  lVar1 = *in_RDX;
  if (lVar1 != 0) {
    plVar2 = (long *)__dynamic_cast(lVar1,&AbstractModule::typeinfo,&StringBodyModule::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)__dynamic_cast(lVar1,&AbstractModule::typeinfo,&Module::typeinfo,0);
      if (plVar2 == (long *)0x0) {
        local_38 = (long *)__dynamic_cast(lVar1,&AbstractModule::typeinfo,&StringModule::typeinfo,0)
        ;
        if (local_38 == (long *)0x0) goto LAB_0015b7a2;
        *in_RDX = 0;
        (**(code **)((node->_M_t).
                     super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                     .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl +
                    0x140))(&local_40,node);
        this->_vptr_Transformer = (_func_int **)local_40;
        plVar2 = local_38;
      }
      else {
        *in_RDX = 0;
        local_30 = plVar2;
        (**(code **)((node->_M_t).
                     super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                     .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl +
                    0x130))(&local_40,node);
        this->_vptr_Transformer = (_func_int **)local_40;
        plVar2 = local_30;
      }
    }
    else {
      *in_RDX = 0;
      local_28 = plVar2;
      (**(code **)((node->_M_t).
                   super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                   .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl + 0x138)
      )(&local_40,node);
      this->_vptr_Transformer = (_func_int **)local_40;
      plVar2 = local_28;
    }
    local_40._vptr_Transformer = (_func_int **)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
    }
    return (__uniq_ptr_data<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>,_true,_true>
            )(__uniq_ptr_data<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>,_true,_true>
              )this;
  }
LAB_0015b7a2:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unreachable");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}